

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O1

int __thiscall
sznet::net::SelectPoller::poll(SelectPoller *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  __fd_mask *p_Var1;
  uint uVar2;
  pointer pEVar3;
  char *pcVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  LogStream *pLVar6;
  char **ppcVar7;
  uint uVar8;
  iterator __begin2;
  pointer pEVar9;
  uint uVar10;
  uint uVar11;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  Logger local_1010;
  undefined1 local_40 [8];
  timeval timeout;
  
  pEVar9 = (this->m_pollfds).
           super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->m_pollfds).
           super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar9 == pEVar3) {
    if (0 < g_logLevel) {
      return 0x150448;
    }
    file_00._8_8_ = 0x10;
    file_00.m_data = "SelectPoller.cpp";
    Logger::Logger(&local_1010,file_00,0x1a,TRACE,"poll");
    if (0x24 < (uint)(((int)&local_1010 + 0xfb0) - (int)local_1010.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1010.m_impl.m_stream.m_buffer.m_cur,
                      "m_pollfds is empty, nothing happened",0x24);
      local_1010.m_impl.m_stream.m_buffer.m_cur = local_1010.m_impl.m_stream.m_buffer.m_cur + 0x24;
    }
  }
  else {
    (this->m_rfds).fds_bits[8] = 0;
    (this->m_rfds).fds_bits[9] = 0;
    (this->m_rfds).fds_bits[10] = 0;
    (this->m_rfds).fds_bits[0xb] = 0;
    (this->m_rfds).fds_bits[0xc] = 0;
    (this->m_rfds).fds_bits[0xd] = 0;
    (this->m_rfds).fds_bits[0xe] = 0;
    (this->m_rfds).fds_bits[0xf] = 0;
    (this->m_rfds).fds_bits[0] = 0;
    (this->m_rfds).fds_bits[1] = 0;
    (this->m_rfds).fds_bits[2] = 0;
    (this->m_rfds).fds_bits[3] = 0;
    (this->m_rfds).fds_bits[4] = 0;
    (this->m_rfds).fds_bits[5] = 0;
    (this->m_rfds).fds_bits[6] = 0;
    (this->m_rfds).fds_bits[7] = 0;
    (this->m_wfds).fds_bits[0] = 0;
    (this->m_wfds).fds_bits[1] = 0;
    (this->m_wfds).fds_bits[2] = 0;
    (this->m_wfds).fds_bits[3] = 0;
    (this->m_wfds).fds_bits[4] = 0;
    (this->m_wfds).fds_bits[5] = 0;
    (this->m_wfds).fds_bits[6] = 0;
    (this->m_wfds).fds_bits[7] = 0;
    (this->m_wfds).fds_bits[8] = 0;
    (this->m_wfds).fds_bits[9] = 0;
    (this->m_wfds).fds_bits[10] = 0;
    (this->m_wfds).fds_bits[0xb] = 0;
    (this->m_wfds).fds_bits[0xc] = 0;
    (this->m_wfds).fds_bits[0xd] = 0;
    (this->m_wfds).fds_bits[0xe] = 0;
    (this->m_wfds).fds_bits[0xf] = 0;
    (this->m_efds).fds_bits[0] = 0;
    (this->m_efds).fds_bits[1] = 0;
    (this->m_efds).fds_bits[2] = 0;
    (this->m_efds).fds_bits[3] = 0;
    (this->m_efds).fds_bits[4] = 0;
    (this->m_efds).fds_bits[5] = 0;
    (this->m_efds).fds_bits[6] = 0;
    (this->m_efds).fds_bits[7] = 0;
    (this->m_efds).fds_bits[8] = 0;
    (this->m_efds).fds_bits[9] = 0;
    (this->m_efds).fds_bits[10] = 0;
    (this->m_efds).fds_bits[0xb] = 0;
    (this->m_efds).fds_bits[0xc] = 0;
    (this->m_efds).fds_bits[0xd] = 0;
    (this->m_efds).fds_bits[0xe] = 0;
    (this->m_efds).fds_bits[0xf] = 0;
    uVar8 = 0;
    do {
      uVar2 = pEVar9->ev;
      if ((uVar2 & 1) != 0) {
        uVar11 = pEVar9->fd;
        uVar10 = uVar11 + 0x3f;
        if (-1 < (int)uVar11) {
          uVar10 = uVar11;
        }
        p_Var1 = (this->m_rfds).fds_bits + ((int)uVar10 >> 6);
        *p_Var1 = *p_Var1 | 1L << ((ulong)uVar11 & 0x3f);
      }
      if ((uVar2 & 8) != 0) {
        uVar2 = pEVar9->fd;
        uVar11 = uVar2 + 0x3f;
        if (-1 < (int)uVar2) {
          uVar11 = uVar2;
        }
        p_Var1 = (this->m_wfds).fds_bits + ((int)uVar11 >> 6);
        *p_Var1 = *p_Var1 | 1L << ((ulong)uVar2 & 0x3f);
      }
      uVar2 = pEVar9->fd;
      uVar11 = uVar2 + 0x3f;
      if (-1 < (int)uVar2) {
        uVar11 = uVar2;
      }
      p_Var1 = (this->m_efds).fds_bits + ((int)uVar11 >> 6);
      *p_Var1 = *p_Var1 | 1L << ((ulong)uVar2 & 0x3f);
      if ((int)uVar8 < (int)uVar2) {
        uVar8 = uVar2;
      }
      pEVar9 = pEVar9 + 1;
    } while (pEVar9 != pEVar3);
    local_40 = (undefined1  [8])(long)((int)__nfds / 1000);
    timeout.tv_sec = (__time_t)(((int)__nfds % 1000) * 1000);
    iVar5 = select(uVar8 + 1,(fd_set *)&this->m_rfds,(fd_set *)&this->m_wfds,(fd_set *)&this->m_efds
                   ,(timeval *)local_40);
    if (0 < iVar5) {
      if (g_logLevel < 1) {
        file._8_8_ = 0x10;
        file.m_data = "SelectPoller.cpp";
        Logger::Logger(&local_1010,file,0x3e,TRACE,"poll");
        pLVar6 = LogStream::operator<<(&local_1010.m_impl.m_stream,iVar5);
        ppcVar7 = &(pLVar6->m_buffer).m_cur;
        pcVar4 = (pLVar6->m_buffer).m_cur;
        if (0x10 < (uint)((int)ppcVar7 - (int)pcVar4)) {
          builtin_strncpy(pcVar4," events happened",0x10);
          *ppcVar7 = *ppcVar7 + 0x10;
        }
        Logger::~Logger(&local_1010);
      }
      fillActiveChannels(this,iVar5,(ChannelList *)__fds);
      return extraout_EAX;
    }
    if (iVar5 == 0) {
      if (0 < g_logLevel) {
        return 0x150448;
      }
      file_02._8_8_ = 0x10;
      file_02.m_data = "SelectPoller.cpp";
      Logger::Logger(&local_1010,file_02,0x43,TRACE,"poll");
      if (0x10 < (uint)(((int)&local_1010 + 0xfb0) - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)
         ) {
        builtin_strncpy(local_1010.m_impl.m_stream.m_buffer.m_cur,"nothing happened",0x10);
        local_1010.m_impl.m_stream.m_buffer.m_cur = local_1010.m_impl.m_stream.m_buffer.m_cur + 0x10
        ;
      }
    }
    else {
      iVar5 = sz_getlasterr();
      if (iVar5 == 4) {
        return 4;
      }
      file_01._8_8_ = 0x10;
      file_01.m_data = "SelectPoller.cpp";
      Logger::Logger(&local_1010,file_01,0x49,false);
      if (0x14 < (uint)(((int)&local_1010 + 0xfb0) - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)
         ) {
        builtin_strncpy(local_1010.m_impl.m_stream.m_buffer.m_cur,"SelectPoller::poll()",0x14);
        local_1010.m_impl.m_stream.m_buffer.m_cur = local_1010.m_impl.m_stream.m_buffer.m_cur + 0x14
        ;
      }
    }
  }
  Logger::~Logger(&local_1010);
  return extraout_EAX_00;
}

Assistant:

void SelectPoller::poll(ChannelList* activeChannels, int timeoutMs)
{
	if (m_pollfds.empty())
	{
		LOG_TRACE << "m_pollfds is empty, nothing happened";
		return;
	}

	FD_ZERO(&m_rfds);
	FD_ZERO(&m_wfds);
	FD_ZERO(&m_efds);
	sockets::sz_fd maxfd = 0;
	for (const auto& elem : m_pollfds)
	{
		if (elem.ev & Channel::kNoneEvent)
		{
			continue;
		}
		if (elem.ev & Channel::kReadEvent)
		{
			FD_SET(elem.fd, &m_rfds);
		}
		if (elem.ev & Channel::kWriteEvent)
		{
			FD_SET(elem.fd, &m_wfds);
		}
		FD_SET(elem.fd, &m_efds);
		if (elem.fd > maxfd)
		{
			maxfd = elem.fd;
		}
	}

	timeval timeout;
	timeout.tv_sec = timeoutMs / 1000;
	timeout.tv_usec = static_cast<int>(timeoutMs % 1000) * 1000;
	int numEvents = select(static_cast<int>(maxfd + 1), &m_rfds, &m_wfds, &m_efds, &timeout);

	if (numEvents > 0)
	{
		LOG_TRACE << numEvents << " events happened";
		fillActiveChannels(numEvents, activeChannels);
	}
	else if (numEvents == 0)
	{
		LOG_TRACE << "nothing happened";
	}
	else
	{
		if (sz_getlasterr() != sz_err_eintr)
		{
			LOG_SYSERR << "SelectPoller::poll()";
		}
	}
	return;
}